

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriter::BeginCustomSection(BinaryWriter *this,char *name)

{
  Stream *this_00;
  char *pcVar1;
  PrintChars in_R9D;
  string_view s;
  char local_88 [8];
  char desc [100];
  
  snprintf(local_88,100,"section \"%s\"",name);
  WriteSectionHeader(this,local_88,Custom);
  this_00 = this->stream_;
  pcVar1 = (char *)strlen(name);
  s.size_ = (size_type)"custom section name";
  s.data_ = pcVar1;
  WriteStr((wabt *)this_00,(Stream *)name,s,&DAT_00000001,in_R9D);
  return;
}

Assistant:

void BinaryWriter::BeginCustomSection(const char* name) {
  char desc[100];
  wabt_snprintf(desc, sizeof(desc), "section \"%s\"", name);
  WriteSectionHeader(desc, BinarySection::Custom);
  WriteStr(stream_, name, "custom section name", PrintChars::Yes);
}